

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector.cpp
# Opt level: O0

void __thiscall VECTOR_HORI_VERT::Vector::Vector(Vector *this,Vector *other)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  int *piVar3;
  uint local_28;
  uint i;
  Vector *other_local;
  Vector *this_local;
  
  this->_vptr_Vector = (_func_int **)&PTR___cxa_pure_virtual_0010bcf0;
  std::__cxx11::string::string((string *)&this->filename_);
  std::__cxx11::string::operator=((string *)&this->filename_,(string *)&other->filename_);
  this->L = other->L;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)this->L;
  uVar2 = SUB168(auVar1 * ZEXT816(4),0);
  if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
    uVar2 = 0xffffffffffffffff;
  }
  piVar3 = (int *)operator_new__(uVar2);
  this->vector_ = piVar3;
  for (local_28 = 0; local_28 < (uint)this->L; local_28 = local_28 + 1) {
    this->vector_[local_28] = other->vector_[local_28];
  }
  this->znak = other->znak;
  return;
}

Assistant:

Vector::Vector(const Vector& other) {
    filename_ = other.filename_;
    L = other.L;
    vector_ = new int[L];
    for (unsigned int i = 0; i < L; i++) {
      vector_[i] = other.vector_[i];
    }
    this->znak = other.znak;
  }